

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O2

optional_ptr<duckdb::LocalSortState,_true> __thiscall
duckdb::WindowMergeSortTree::AddLocalSort(WindowMergeSortTree *this)

{
  _Head_base<0UL,_duckdb::LocalSortState_*,_false> _Var1;
  pointer this_00;
  type global_sort_state;
  pointer pGVar2;
  reference pvVar3;
  templated_unique_single_t local_sort;
  unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_> local_30;
  
  ::std::mutex::lock(&this->lock);
  make_uniq<duckdb::LocalSortState>();
  this_00 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
            operator->((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                        *)&local_30);
  global_sort_state =
       unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
       operator*(&this->global_sort);
  pGVar2 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(&this->global_sort);
  LocalSortState::Initialize(this_00,global_sort_state,pGVar2->buffer_manager);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>,std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>,std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>>>
              *)&this->local_sorts,
             (unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
              *)&local_30);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_true>
           ::back(&this->local_sorts);
  _Var1._M_head_impl =
       (pvVar3->
       super_unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>)._M_t.
       super___uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
       .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl;
  ::std::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>::
  ~unique_ptr(&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return (optional_ptr<duckdb::LocalSortState,_true>)_Var1._M_head_impl;
}

Assistant:

optional_ptr<LocalSortState> WindowMergeSortTree::AddLocalSort() {
	lock_guard<mutex> local_sort_guard(lock);
	auto local_sort = make_uniq<LocalSortState>();
	local_sort->Initialize(*global_sort, global_sort->buffer_manager);
	local_sorts.emplace_back(std::move(local_sort));

	return local_sorts.back().get();
}